

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS ref_search_distance(REF_SEARCH ref_search,REF_INT a,REF_INT b,REF_DBL *distance)

{
  int extraout_EAX;
  int iVar1;
  long lVar2;
  double __x;
  REF_DBL RVar3;
  double dVar4;
  
  *distance = 0.0;
  iVar1 = ref_search->d;
  __x = 0.0;
  for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
    dVar4 = ref_search->pos[b * iVar1 + lVar2] - ref_search->pos[a * iVar1 + lVar2];
    __x = __x + dVar4 * dVar4;
    *distance = __x;
  }
  if (__x < 0.0) {
    RVar3 = sqrt(__x);
    iVar1 = extraout_EAX;
  }
  else {
    RVar3 = SQRT(__x);
  }
  *distance = RVar3;
  return iVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_search_distance(REF_SEARCH ref_search, REF_INT a,
                                              REF_INT b, REF_DBL *distance) {
  REF_INT i;
  *distance = 0.0;
  for (i = 0; i < ref_search->d; i++)
    (*distance) += pow(ref_search->pos[i + ref_search->d * b] -
                           ref_search->pos[i + ref_search->d * a],
                       2);
  (*distance) = sqrt(*distance);
  return REF_SUCCESS;
}